

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::MLABecLaplacian
          (MLABecLaplacian *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
          *a_overset_mask,LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,int a_ncomp)

{
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_RDI;
  int in_R8D;
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *in_R9;
  pointer pGVar1;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  LPInfo *in_stack_ffffffffffffff98;
  pointer *a_overset_mask_00;
  pointer *a_dmap_00;
  pointer *a_grids_00;
  MLABecLaplacian *in_stack_ffffffffffffffc0;
  
  MLCellABecLap::MLCellABecLap
            ((MLCellABecLap *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  (in_RDI->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__MLABecLaplacian_01804998;
  *(undefined1 *)
   &in_RDI[0x21].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  pGVar1 = (pointer)std::numeric_limits<double>::quiet_NaN();
  in_RDI[0x21].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pGVar1;
  pGVar1 = (pointer)std::numeric_limits<double>::quiet_NaN();
  in_RDI[0x22].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = pGVar1;
  a_overset_mask_00 =
       &in_RDI[0x22].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
        super__Vector_impl_data._M_finish;
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            *)0x12b146b);
  a_dmap_00 = &in_RDI[0x23].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::Vector((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)0x12b1481);
  a_grids_00 = &in_RDI[0x24].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                super__Vector_impl_data._M_finish;
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x12b1497);
  *(undefined4 *)
   &in_RDI[0x25].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  define(in_stack_ffffffffffffffc0,in_RDI,
         (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)a_grids_00,
         (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
         a_dmap_00,
         (Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_> *)
         a_overset_mask_00,in_stack_ffffffffffffff98,in_R9,in_R8D);
  return;
}

Assistant:

MLABecLaplacian::MLABecLaplacian (const Vector<Geometry>& a_geom,
                                  const Vector<BoxArray>& a_grids,
                                  const Vector<DistributionMapping>& a_dmap,
                                  const Vector<iMultiFab const*>& a_overset_mask,
                                  const LPInfo& a_info,
                                  const Vector<FabFactory<FArrayBox> const*>& a_factory,
                                  const int a_ncomp)
{
    define(a_geom, a_grids, a_dmap, a_overset_mask, a_info, a_factory, a_ncomp);
}